

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

bool el::base::utils::Utils::
     installCallback<el::base::DefaultLogDispatchCallback,std::shared_ptr<el::LogDispatchCallback>>
               (string *id,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
               *mapT)

{
  pointer pcVar1;
  iterator iVar2;
  DefaultLogDispatchCallback *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  DefaultLogDispatchCallback *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_28;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&mapT->_M_h,id);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    __p = (DefaultLogDispatchCallback *)operator_new(0x58);
    (__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
    _vptr_ThreadSafe = (_func_int **)0x0;
    *(undefined8 *)
     &(__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
      field_0x8 = 0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_buckets = (__buckets_ptr)0x0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_bucket_count = 0;
    *(undefined8 *)&(__p->super_LogDispatchCallback).m_fileLocks._M_h._M_rehash_policy = 0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_rehash_policy._M_next_resize = 0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
    *(undefined8 *)&(__p->super_LogDispatchCallback).field_0x48 = 0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_element_count = 0;
    __p->m_data = (LogDispatchData *)0x0;
    (__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.field_0x9
         = 1;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_buckets =
         &(__p->super_LogDispatchCallback).m_fileLocks._M_h._M_single_bucket;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_bucket_count = 1;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_rehash_policy._M_next_resize = 0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
    _vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0012c3e0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<el::base::DefaultLogDispatchCallback*>(a_Stack_60,__p);
    pcVar1 = (id->_M_dataplus)._M_p;
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + id->_M_string_length);
    p_Stack_28 = a_Stack_60[0]._M_pi;
    a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_30 = __p;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<el::LogDispatchCallback>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)mapT);
    if (p_Stack_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_28);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
    }
  }
  return iVar2.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_true>
         ._M_cur == (__node_type *)0x0;
}

Assistant:

static bool installCallback(const std::string& id, std::unordered_map<std::string, TPtr>* mapT) {
    if (mapT->find(id) == mapT->end()) {
      mapT->insert(std::make_pair(id, TPtr(new T())));
      return true;
    }
    return false;
  }